

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbgfx_test.cpp
# Opt level: O2

void __thiscall Png::~Png(Png *this)

{
  png_destroy_read_struct(&this->png,&this->info,0);
  std::_Vector_base<Rgba,_default_init_allocator<Rgba,_std::allocator<Rgba>_>_>::~_Vector_base
            (&(this->pixels).
              super__Vector_base<Rgba,_default_init_allocator<Rgba,_std::allocator<Rgba>_>_>);
  std::filebuf::~filebuf(&this->file);
  return;
}

Assistant:

~Png() { png_destroy_read_struct(&png, &info, nullptr); }